

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_hash_table_val_equal(void *val1_p,void *val2_p,int mod,void *UNUSED_cb_data)

{
  lyd_node *node1;
  lyd_node *node2;
  lys_node *plVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  node1 = *val1_p;
  node2 = *val2_p;
  if (mod == 0) {
    plVar1 = node1->schema;
    uVar4 = 0;
    if (plVar1 == node2->schema) {
      uVar3 = (ulong)plVar1->nodetype;
      uVar4 = 1;
      if (uVar3 < 0x21) {
        if ((0x100000012U >> (uVar3 & 0x3f) & 1) != 0) {
          return 1;
        }
        if ((0x10100UL >> (uVar3 & 0x3f) & 1) != 0) {
          iVar2 = lyd_list_equal(node1,node2,0);
          return iVar2;
        }
      }
      if (plVar1->nodetype != LYS_ANYDATA) {
        uVar4 = 0;
        ly_log(plVar1->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x13d);
      }
    }
  }
  else {
    uVar4 = (uint)(node1 == node2);
  }
  return uVar4;
}

Assistant:

static int
lyd_hash_table_val_equal(void *val1_p, void *val2_p, int mod, void *UNUSED(cb_data))
{
    struct lyd_node *val1, *val2;

    val1 = *((struct lyd_node **)val1_p);
    val2 = *((struct lyd_node **)val2_p);

    if (mod) {
        if (val1 == val2) {
            return 1;
        } else {
            return 0;
        }
    }

    if (val1->schema != val2->schema) {
        return 0;
    }

    switch (val1->schema->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return 1;
    case LYS_LEAFLIST:
    case LYS_LIST:
        return lyd_list_equal(val1, val2, 0);
    default:
        break;
    }

    LOGINT(val1->schema->module->ctx);
    return 0;
}